

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O2

exr_result_t
LossyDctEncoder_execute
          (_func_void_ptr_size_t *alloc_fn,_func_void_void_ptr *free_fn,LossyDctEncoder *e)

{
  uint64_t *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  DctCoderChannelData *pDVar15;
  uint8_t **ppuVar16;
  uint8_t *puVar17;
  uint uVar18;
  DctCoderChannelData *pDVar19;
  uint16_t uVar20;
  ushort uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  int i;
  int iVar25;
  ulong uVar26;
  uint8_t *puVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  uint16_t *puVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ushort *puVar39;
  ulong uVar40;
  int i_1;
  DctCoderChannelData *pDVar41;
  ulong uVar42;
  int x;
  uint8_t *puVar43;
  long lVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  uint local_1a8;
  float *local_140;
  DctCoderChannelData *chanData [3];
  uint local_c0;
  uint16_t halfZigCoef [64];
  
  iVar25 = e->_width;
  uVar13 = e->_channel_encode_data_count;
  iVar31 = e->_height;
  fVar45 = ceilf((float)iVar25 * 0.125);
  fVar46 = ceilf((float)iVar31 * 0.125);
  puVar39 = (ushort *)e->_packedAc;
  uVar26 = 0;
  uVar32 = 0;
  if (0 < (int)uVar13) {
    uVar32 = (ulong)uVar13;
  }
  puVar1 = &e->_numAcComp;
  e->_numAcComp = 0;
  e->_numDcComp = 0;
  iVar28 = 0;
  for (; uVar32 != uVar26; uVar26 = uVar26 + 1) {
    pDVar15 = e->_channel_encode_data[uVar26];
    chanData[uVar26] = pDVar15;
    iVar35 = 0;
    if (pDVar15->_type == EXR_PIXEL_FLOAT) {
      iVar35 = iVar31 * iVar25;
    }
    iVar28 = iVar28 + iVar35;
  }
  if (iVar28 == 0) {
    puVar27 = (uint8_t *)0x0;
  }
  else {
    puVar27 = (uint8_t *)(*alloc_fn)((long)iVar28 * 2);
    if (puVar27 == (uint8_t *)0x0) {
      return 1;
    }
  }
  uVar29 = (uint)fVar45;
  uVar30 = (uint)fVar46;
  puVar43 = puVar27;
  for (uVar26 = 0; uVar26 != uVar32; uVar26 = uVar26 + 1) {
    pDVar15 = chanData[uVar26];
    if (pDVar15->_type == EXR_PIXEL_FLOAT) {
      uVar18 = e->_height;
      if (e->_height < 1) {
        uVar18 = 0;
      }
      for (uVar38 = 0; uVar38 != uVar18; uVar38 = uVar38 + 1) {
        ppuVar16 = pDVar15->_rows;
        puVar17 = ppuVar16[uVar38];
        uVar14 = e->_width;
        uVar40 = 0;
        if (0 < (int)uVar14) {
          uVar40 = (ulong)uVar14;
        }
        for (uVar37 = 0; uVar40 != uVar37; uVar37 = uVar37 + 1) {
          fVar45 = *(float *)(puVar17 + uVar37 * 4);
          fVar46 = 65504.0;
          if ((fVar45 <= 65504.0) && (fVar46 = fVar45, fVar45 < -65504.0)) {
            fVar46 = -65504.0;
          }
          uVar20 = float_to_half(fVar46);
          *(uint16_t *)(puVar43 + uVar37 * 2) = uVar20;
        }
        ppuVar16[uVar38] = puVar43;
        puVar43 = puVar43 + (long)(int)uVar14 * 2;
      }
    }
  }
  puVar34 = (uint16_t *)e->_packedDc;
  chanData[0]->_dc_comp = puVar34;
  for (lVar36 = 1; puVar34 = puVar34 + (int)(uVar30 * uVar29), lVar36 < (int)uVar13;
      lVar36 = lVar36 + 1) {
    chanData[lVar36]->_dc_comp = puVar34;
  }
  uVar26 = (ulong)uVar29;
  if ((int)uVar29 < 1) {
    uVar26 = 0;
  }
  uVar38 = (ulong)uVar30;
  if ((int)uVar30 < 1) {
    uVar38 = 0;
  }
  uVar40 = 0;
  do {
    pDVar19 = chanData[2];
    pDVar15 = chanData[1];
    if (uVar40 == uVar38) {
      if (puVar27 != (uint8_t *)0x0) {
        (*free_fn)(puVar27);
      }
      return 0;
    }
    local_c0 = (int)uVar40 * 8;
    for (uVar37 = 0; uVar37 != uVar26; uVar37 = uVar37 + 1) {
      local_1a8 = (int)uVar37 * 8;
      for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
        iVar25 = e->_width;
        iVar31 = e->_height;
        pDVar41 = chanData[uVar33];
        ppuVar16 = pDVar41->_rows;
        puVar34 = e->_toNonlinear;
        for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
          uVar30 = (uint)lVar36 | local_c0;
          uVar29 = ~uVar30 + iVar31 * 2;
          if ((int)uVar30 < iVar31) {
            uVar29 = uVar30;
          }
          if ((int)uVar29 < 0) {
            uVar29 = iVar31 - 1;
          }
          puVar43 = ppuVar16[(int)uVar29];
          for (lVar44 = 0; lVar44 != 8; lVar44 = lVar44 + 1) {
            uVar30 = (uint)lVar44 | local_1a8;
            uVar29 = ~uVar30 + iVar25 * 2;
            if ((int)uVar30 < iVar25) {
              uVar29 = uVar30;
            }
            if ((int)uVar29 < 0) {
              uVar29 = iVar25 - 1;
            }
            uVar21 = *(ushort *)(puVar43 + (long)(int)uVar29 * 2);
            if (puVar34 != (uint16_t *)0x0) {
              uVar21 = puVar34[uVar21];
            }
            fVar45 = half_to_float(uVar21);
            pDVar41->_dctData[lVar44] = fVar45;
          }
          pDVar41 = (DctCoderChannelData *)(pDVar41->_dctData + 8);
        }
      }
      if (uVar13 == 3) {
        for (lVar36 = 0; lVar36 != 0x40; lVar36 = lVar36 + 1) {
          fVar45 = chanData[0]->_dctData[lVar36];
          fVar46 = pDVar15->_dctData[lVar36];
          fVar47 = pDVar19->_dctData[lVar36];
          chanData[0]->_dctData[lVar36] = fVar47 * 0.0722 + fVar45 * 0.2126 + fVar46 * 0.7152;
          pDVar15->_dctData[lVar36] = fVar47 * 0.5 + fVar45 * -0.1146 + fVar46 * -0.3854;
          pDVar19->_dctData[lVar36] = fVar47 * -0.0458 + fVar45 * 0.5 + fVar46 * -0.4542;
        }
      }
      puVar34 = e->_hquantTableY;
      local_140 = e->_quantTableY;
      for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
        pDVar41 = chanData[uVar33];
        for (iVar25 = 0; iVar25 != 2; iVar25 = iVar25 + 1) {
          for (lVar36 = 0xe0; lVar36 != 0x100; lVar36 = lVar36 + 0x10) {
            pfVar9 = (float *)((long)pDVar41->_dctData + lVar36);
            pfVar6 = (float *)((long)pDVar41 + lVar36 + -0xe0);
            pfVar7 = (float *)((long)pDVar41 + lVar36 + -0xc0);
            pfVar8 = (float *)((long)pDVar41 + lVar36 + -0xa0);
            pfVar2 = (float *)((long)pDVar41->_dctData + lVar36 + -0x80);
            fVar65 = *pfVar6 + *pfVar9;
            fVar66 = pfVar6[1] + pfVar9[1];
            fVar67 = pfVar6[2] + pfVar9[2];
            fVar68 = pfVar6[3] + pfVar9[3];
            fVar45 = *pfVar7 + *pfVar8;
            fVar46 = pfVar7[1] + pfVar8[1];
            fVar47 = pfVar7[2] + pfVar8[2];
            fVar48 = pfVar7[3] + pfVar8[3];
            pfVar3 = (float *)((long)pDVar41->_dctData + lVar36 + -0x60);
            fVar73 = *pfVar2 + *pfVar3;
            fVar74 = pfVar2[1] + pfVar3[1];
            fVar75 = pfVar2[2] + pfVar3[2];
            fVar76 = pfVar2[3] + pfVar3[3];
            pfVar4 = (float *)((long)pDVar41->_dctData + lVar36 + -0x40);
            pfVar5 = (float *)((long)pDVar41->_dctData + lVar36 + -0x20);
            fVar53 = *pfVar6 - *pfVar9;
            fVar54 = pfVar6[1] - pfVar9[1];
            fVar55 = pfVar6[2] - pfVar9[2];
            fVar56 = pfVar6[3] - pfVar9[3];
            fVar69 = *pfVar4 + *pfVar5;
            fVar70 = pfVar4[1] + pfVar5[1];
            fVar71 = pfVar4[2] + pfVar5[2];
            fVar72 = pfVar4[3] + pfVar5[3];
            fVar61 = *pfVar7 - *pfVar8;
            fVar62 = pfVar7[1] - pfVar8[1];
            fVar63 = pfVar7[2] - pfVar8[2];
            fVar64 = pfVar7[3] - pfVar8[3];
            fVar57 = *pfVar2 - *pfVar3;
            fVar58 = pfVar2[1] - pfVar3[1];
            fVar59 = pfVar2[2] - pfVar3[2];
            fVar60 = pfVar2[3] - pfVar3[3];
            fVar49 = *pfVar4 - *pfVar5;
            fVar50 = pfVar4[1] - pfVar5[1];
            fVar51 = pfVar4[2] - pfVar5[2];
            fVar52 = pfVar4[3] - pfVar5[3];
            fVar77 = (fVar65 + fVar73) * 0.70710677;
            fVar78 = (fVar66 + fVar74) * 0.70710677;
            fVar79 = (fVar67 + fVar75) * 0.70710677;
            fVar80 = (fVar68 + fVar76) * 0.70710677;
            fVar81 = (fVar45 + fVar69) * 0.70710677;
            fVar82 = (fVar46 + fVar70) * 0.70710677;
            fVar83 = (fVar47 + fVar71) * 0.70710677;
            fVar84 = (fVar48 + fVar72) * 0.70710677;
            pfVar9 = (float *)((long)pDVar41 + lVar36 + -0xe0);
            *pfVar9 = (fVar77 + fVar81) * 0.5;
            pfVar9[1] = (fVar78 + fVar82) * 0.5;
            pfVar9[2] = (fVar79 + fVar83) * 0.5;
            pfVar9[3] = (fVar80 + fVar84) * 0.5;
            pfVar9 = (float *)((long)pDVar41->_dctData + lVar36 + -0x60);
            *pfVar9 = (fVar77 - fVar81) * 0.5;
            pfVar9[1] = (fVar78 - fVar82) * 0.5;
            pfVar9[2] = (fVar79 - fVar83) * 0.5;
            pfVar9[3] = (fVar80 - fVar84) * 0.5;
            fVar77 = fVar61 - fVar49;
            fVar78 = fVar62 - fVar50;
            fVar79 = fVar63 - fVar51;
            fVar80 = fVar64 - fVar52;
            fVar65 = fVar65 - fVar73;
            fVar66 = fVar66 - fVar74;
            fVar67 = fVar67 - fVar75;
            fVar68 = fVar68 - fVar76;
            pfVar9 = (float *)((long)pDVar41 + lVar36 + -0xa0);
            *pfVar9 = fVar65 * 0.46193978 + fVar77 * 0.19134171;
            pfVar9[1] = fVar66 * 0.46193978 + fVar78 * 0.19134171;
            pfVar9[2] = fVar67 * 0.46193978 + fVar79 * 0.19134171;
            pfVar9[3] = fVar68 * 0.46193978 + fVar80 * 0.19134171;
            pfVar9 = (float *)((long)pDVar41->_dctData + lVar36 + -0x20);
            *pfVar9 = fVar65 * 0.19134171 - fVar77 * 0.46193978;
            pfVar9[1] = fVar66 * 0.19134171 - fVar78 * 0.46193978;
            pfVar9[2] = fVar67 * 0.19134171 - fVar79 * 0.46193978;
            pfVar9[3] = fVar68 * 0.19134171 - fVar80 * 0.46193978;
            fVar45 = (fVar45 - fVar69) * 0.70710677;
            fVar46 = (fVar46 - fVar70) * 0.70710677;
            fVar47 = (fVar47 - fVar71) * 0.70710677;
            fVar48 = (fVar48 - fVar72) * 0.70710677;
            fVar49 = (fVar49 + fVar61) * -0.70710677;
            fVar50 = (fVar50 + fVar62) * -0.70710677;
            fVar51 = (fVar51 + fVar63) * -0.70710677;
            fVar52 = (fVar52 + fVar64) * -0.70710677;
            fVar61 = fVar53 - fVar45;
            fVar62 = fVar54 - fVar46;
            fVar63 = fVar55 - fVar47;
            fVar64 = fVar56 - fVar48;
            fVar65 = fVar57 + fVar49;
            fVar66 = fVar58 + fVar50;
            fVar67 = fVar59 + fVar51;
            fVar68 = fVar60 + fVar52;
            pfVar9 = (float *)((long)pDVar41->_dctData + lVar36 + -0x80);
            *pfVar9 = fVar61 * 0.4157348 - fVar65 * 0.27778512;
            pfVar9[1] = fVar62 * 0.4157348 - fVar66 * 0.27778512;
            pfVar9[2] = fVar63 * 0.4157348 - fVar67 * 0.27778512;
            pfVar9[3] = fVar64 * 0.4157348 - fVar68 * 0.27778512;
            pfVar9 = (float *)((long)pDVar41->_dctData + lVar36 + -0x40);
            *pfVar9 = fVar65 * 0.4157348 + fVar61 * 0.27778512;
            pfVar9[1] = fVar66 * 0.4157348 + fVar62 * 0.27778512;
            pfVar9[2] = fVar67 * 0.4157348 + fVar63 * 0.27778512;
            pfVar9[3] = fVar68 * 0.4157348 + fVar64 * 0.27778512;
            fVar45 = fVar45 + fVar53;
            fVar46 = fVar46 + fVar54;
            fVar47 = fVar47 + fVar55;
            fVar48 = fVar48 + fVar56;
            fVar49 = fVar49 - fVar57;
            fVar50 = fVar50 - fVar58;
            fVar51 = fVar51 - fVar59;
            fVar52 = fVar52 - fVar60;
            pfVar9 = (float *)((long)pDVar41 + lVar36 + -0xc0);
            *pfVar9 = fVar45 * 0.49039263 - fVar49 * 0.09754516;
            pfVar9[1] = fVar46 * 0.49039263 - fVar50 * 0.09754516;
            pfVar9[2] = fVar47 * 0.49039263 - fVar51 * 0.09754516;
            pfVar9[3] = fVar48 * 0.49039263 - fVar52 * 0.09754516;
            pfVar9 = (float *)((long)pDVar41->_dctData + lVar36);
            *pfVar9 = fVar49 * 0.49039263 + fVar45 * 0.09754516;
            pfVar9[1] = fVar50 * 0.49039263 + fVar46 * 0.09754516;
            pfVar9[2] = fVar51 * 0.49039263 + fVar47 * 0.09754516;
            pfVar9[3] = fVar52 * 0.49039263 + fVar48 * 0.09754516;
          }
          fVar45 = pDVar41->_dctData[1];
          fVar46 = pDVar41->_dctData[2];
          fVar47 = pDVar41->_dctData[3];
          fVar48 = pDVar41->_dctData[4];
          fVar49 = pDVar41->_dctData[5];
          fVar50 = pDVar41->_dctData[6];
          fVar51 = pDVar41->_dctData[7];
          fVar52 = pDVar41->_dctData[8];
          fVar53 = pDVar41->_dctData[9];
          fVar54 = pDVar41->_dctData[10];
          fVar55 = pDVar41->_dctData[0xb];
          fVar56 = pDVar41->_dctData[0xc];
          fVar57 = pDVar41->_dctData[0xd];
          fVar58 = pDVar41->_dctData[0xe];
          fVar59 = pDVar41->_dctData[0xf];
          fVar60 = pDVar41->_dctData[0x10];
          fVar61 = pDVar41->_dctData[0x11];
          fVar62 = pDVar41->_dctData[0x12];
          fVar63 = pDVar41->_dctData[0x13];
          fVar64 = pDVar41->_dctData[0x18];
          fVar65 = pDVar41->_dctData[0x19];
          fVar66 = pDVar41->_dctData[0x1a];
          fVar67 = pDVar41->_dctData[0x1b];
          fVar68 = pDVar41->_dctData[0x24];
          fVar69 = pDVar41->_dctData[0x25];
          fVar70 = pDVar41->_dctData[0x26];
          fVar71 = pDVar41->_dctData[0x27];
          fVar72 = pDVar41->_dctData[0x2c];
          fVar73 = pDVar41->_dctData[0x2d];
          fVar74 = pDVar41->_dctData[0x2e];
          fVar75 = pDVar41->_dctData[0x2f];
          fVar76 = pDVar41->_dctData[0x34];
          fVar77 = pDVar41->_dctData[0x35];
          fVar78 = pDVar41->_dctData[0x36];
          fVar79 = pDVar41->_dctData[0x37];
          fVar80 = pDVar41->_dctData[0x3c];
          fVar81 = pDVar41->_dctData[0x3d];
          fVar82 = pDVar41->_dctData[0x3e];
          fVar83 = pDVar41->_dctData[0x3f];
          pDVar41->_dctData[0] = pDVar41->_dctData[0];
          pDVar41->_dctData[1] = fVar52;
          pDVar41->_dctData[2] = fVar60;
          pDVar41->_dctData[3] = fVar64;
          pDVar41->_dctData[0x10] = fVar46;
          pDVar41->_dctData[0x11] = fVar54;
          pDVar41->_dctData[0x12] = fVar62;
          pDVar41->_dctData[0x13] = fVar66;
          pDVar41->_dctData[8] = fVar45;
          pDVar41->_dctData[9] = fVar53;
          pDVar41->_dctData[10] = fVar61;
          pDVar41->_dctData[0xb] = fVar65;
          pDVar41->_dctData[0x18] = fVar47;
          pDVar41->_dctData[0x19] = fVar55;
          pDVar41->_dctData[0x1a] = fVar63;
          pDVar41->_dctData[0x1b] = fVar67;
          pDVar41->_dctData[0x24] = fVar68;
          pDVar41->_dctData[0x25] = fVar72;
          pDVar41->_dctData[0x26] = fVar76;
          pDVar41->_dctData[0x27] = fVar80;
          pDVar41->_dctData[0x34] = fVar70;
          pDVar41->_dctData[0x35] = fVar74;
          pDVar41->_dctData[0x36] = fVar78;
          pDVar41->_dctData[0x37] = fVar82;
          pDVar41->_dctData[0x2c] = fVar69;
          pDVar41->_dctData[0x2d] = fVar73;
          pDVar41->_dctData[0x2e] = fVar77;
          pDVar41->_dctData[0x2f] = fVar81;
          pDVar41->_dctData[0x3c] = fVar71;
          pDVar41->_dctData[0x3d] = fVar75;
          pDVar41->_dctData[0x3e] = fVar79;
          pDVar41->_dctData[0x3f] = fVar83;
          fVar45 = pDVar41->_dctData[0x20];
          fVar46 = pDVar41->_dctData[0x21];
          fVar47 = pDVar41->_dctData[0x22];
          fVar52 = pDVar41->_dctData[0x23];
          fVar53 = pDVar41->_dctData[0x28];
          fVar54 = pDVar41->_dctData[0x29];
          fVar55 = pDVar41->_dctData[0x2a];
          fVar60 = pDVar41->_dctData[0x2b];
          fVar61 = pDVar41->_dctData[0x30];
          fVar62 = pDVar41->_dctData[0x31];
          fVar63 = pDVar41->_dctData[0x32];
          fVar64 = pDVar41->_dctData[0x33];
          fVar65 = pDVar41->_dctData[0x38];
          fVar66 = pDVar41->_dctData[0x39];
          fVar67 = pDVar41->_dctData[0x3a];
          fVar68 = pDVar41->_dctData[0x3b];
          pDVar41->_dctData[0x20] = fVar48;
          pDVar41->_dctData[0x21] = fVar56;
          pDVar41->_dctData[0x22] = pDVar41->_dctData[0x14];
          pDVar41->_dctData[0x23] = pDVar41->_dctData[0x1c];
          pDVar41->_dctData[0x30] = fVar50;
          pDVar41->_dctData[0x31] = fVar58;
          pDVar41->_dctData[0x32] = pDVar41->_dctData[0x16];
          pDVar41->_dctData[0x33] = pDVar41->_dctData[0x1e];
          pDVar41->_dctData[0x28] = fVar49;
          pDVar41->_dctData[0x29] = fVar57;
          pDVar41->_dctData[0x2a] = pDVar41->_dctData[0x15];
          pDVar41->_dctData[0x2b] = pDVar41->_dctData[0x1d];
          pDVar41->_dctData[0x38] = fVar51;
          pDVar41->_dctData[0x39] = fVar59;
          pDVar41->_dctData[0x3a] = pDVar41->_dctData[0x17];
          pDVar41->_dctData[0x3b] = pDVar41->_dctData[0x1f];
          pDVar41->_dctData[4] = fVar45;
          pDVar41->_dctData[5] = fVar53;
          pDVar41->_dctData[6] = fVar61;
          pDVar41->_dctData[7] = fVar65;
          pDVar41->_dctData[0x14] = fVar47;
          pDVar41->_dctData[0x15] = fVar55;
          pDVar41->_dctData[0x16] = fVar63;
          pDVar41->_dctData[0x17] = fVar67;
          pDVar41->_dctData[0xc] = fVar46;
          pDVar41->_dctData[0xd] = fVar54;
          pDVar41->_dctData[0xe] = fVar62;
          pDVar41->_dctData[0xf] = fVar66;
          pDVar41->_dctData[0x1c] = fVar52;
          pDVar41->_dctData[0x1d] = fVar60;
          pDVar41->_dctData[0x1e] = fVar64;
          pDVar41->_dctData[0x1f] = fVar68;
        }
        for (uVar42 = 0; uVar42 < 0x40; uVar42 = uVar42 + 4) {
          uVar20 = float_to_half(pDVar41->_dctData[uVar42]);
          uVar22 = float_to_half(pDVar41->_dctData[uVar42 + 1]);
          uVar23 = float_to_half(pDVar41->_dctData[uVar42 + 2]);
          uVar24 = float_to_half(pDVar41->_dctData[uVar42 + 3]);
          fVar45 = local_140[uVar42];
          fVar46 = local_140[uVar42 + 1];
          fVar47 = local_140[uVar42 + 2];
          fVar48 = local_140[uVar42 + 3];
          uVar21 = puVar34[uVar42];
          uVar10 = puVar34[uVar42 + 1];
          uVar11 = puVar34[uVar42 + 2];
          uVar12 = puVar34[uVar42 + 3];
          fVar49 = half_to_float(uVar20);
          uVar20 = algoQuantize((uint)uVar20,(uint)uVar21,fVar45,fVar49);
          fVar45 = half_to_float(uVar22);
          uVar22 = algoQuantize((uint)uVar22,(uint)uVar10,fVar46,fVar45);
          fVar45 = half_to_float(uVar23);
          uVar23 = algoQuantize((uint)uVar23,(uint)uVar11,fVar47,fVar45);
          fVar45 = half_to_float(uVar24);
          uVar24 = algoQuantize((uint)uVar24,(uint)uVar12,fVar48,fVar45);
          halfZigCoef[(int)(&quantizeCoeffAndZigXDR_inv_remap)[uVar42]] = uVar20;
          halfZigCoef[(int)(&DAT_0018d5e4)[uVar42]] = uVar22;
          halfZigCoef[(int)(&DAT_0018d5e8)[uVar42]] = uVar23;
          halfZigCoef[(int)(&DAT_0018d5ec)[uVar42]] = uVar24;
        }
        puVar34 = pDVar41->_dc_comp;
        pDVar41->_dc_comp = puVar34 + 1;
        *puVar34 = halfZigCoef[0];
        e->_numDcComp = e->_numDcComp + 1;
        iVar25 = 1;
        while (iVar25 < 0x40) {
          if (halfZigCoef[iVar25] == 0) {
            uVar21 = 1;
            while ((iVar31 = (uint)uVar21 + iVar25, iVar31 < 0x40 && (halfZigCoef[iVar31] == 0))) {
              uVar21 = uVar21 + 1;
            }
            if (uVar21 == 1) {
              *puVar39 = 0;
            }
            else {
              if (iVar31 == 0x40) {
                *puVar39 = 0xff00;
                *puVar1 = *puVar1 + 1;
                iVar25 = 0x40;
                goto LAB_0010cb71;
              }
              *puVar39 = uVar21 | 0xff00;
            }
            *puVar1 = *puVar1 + 1;
            iVar25 = iVar31;
          }
          else {
            *puVar39 = halfZigCoef[iVar25];
            *puVar1 = *puVar1 + 1;
            iVar25 = iVar25 + 1;
          }
LAB_0010cb71:
          puVar39 = puVar39 + 1;
        }
        puVar34 = e->_hquantTableCbCr;
        local_140 = e->_quantTableCbCr;
      }
    }
    uVar40 = uVar40 + 1;
  } while( true );
}

Assistant:

exr_result_t
LossyDctEncoder_execute (
    void* (*alloc_fn) (size_t), void (*free_fn) (void*), LossyDctEncoder* e)
{
    int                  numComp = e->_channel_encode_data_count;
    DctCoderChannelData* chanData[3];

    int numBlocksX = (int) (ceilf ((float) e->_width / 8.0f));
    int numBlocksY = (int) (ceilf ((float) e->_height / 8.0f));

    uint16_t halfZigCoef[64];

    uint16_t* currAcComp            = (uint16_t*) e->_packedAc;
    int       tmpHalfBufferElements = 0;
    uint16_t* tmpHalfBuffer         = NULL;
    uint16_t* tmpHalfBufferPtr      = NULL;

    e->_numAcComp = 0;
    e->_numDcComp = 0;

    //
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        chanData[chan] = e->_channel_encode_data[chan];
        if (chanData[chan]->_type == EXR_PIXEL_FLOAT)
            tmpHalfBufferElements += e->_width * e->_height;
    }

    if (tmpHalfBufferElements)
    {
        tmpHalfBuffer = (uint16_t*) alloc_fn (
            (size_t) tmpHalfBufferElements * sizeof (uint16_t));
        if (!tmpHalfBuffer) return EXR_ERR_OUT_OF_MEMORY;
        tmpHalfBufferPtr = tmpHalfBuffer;
    }

    //
    // Run over all the float scanlines, quantizing,
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (int chan = 0; chan < numComp; ++chan)
    {
        if (chanData[chan]->_type != EXR_PIXEL_FLOAT) continue;

        for (int y = 0; y < e->_height; ++y)
        {
            const float* srcXdr = (const float*) chanData[chan]->_rows[y];

            for (int x = 0; x < e->_width; ++x)
            {
                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                float src = one_to_native_float (srcXdr[x]);
                if (src > 65504.f)
                    src = 65504.f;
                else if (src < -65504.f)
                    src = -65504.f;
                tmpHalfBufferPtr[x] = one_from_native16 (float_to_half (src));
            }

            chanData[chan]->_rows[y] = (uint8_t*) tmpHalfBufferPtr;
            tmpHalfBufferPtr += e->_width;
        }
    }

    //
    // Pack DC components together by common plane, so we can get
    // a little more out of differencing them. We'll always have
    // one component per block, so we can computed offsets.
    //

    chanData[0]->_dc_comp = (uint16_t*) e->_packedDc;
    for (int chan = 1; chan < numComp; ++chan)
        chanData[chan]->_dc_comp =
            chanData[chan - 1]->_dc_comp + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            uint16_t              h;
            const float* restrict quantTable;
            const uint16_t* restrict hquantTable;

            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= e->_width)
                            vx = e->_width - (vx - (e->_width - 1));

                        if (vx < 0) vx = e->_width - 1;

                        if (vy >= e->_height)
                            vy = e->_height - (vy - (e->_height - 1));

                        if (vy < 0) vy = e->_height - 1;

                        h = ((const uint16_t*) (chanData[chan]->_rows)[vy])[vx];

                        if (e->_toNonlinear) { h = e->_toNonlinear[h]; }
                        else { h = one_to_native16 (h); }

                        chanData[chan]->_dctData[y * 8 + x] = half_to_float (h);
                    } // x
                }     // y
            }         // chan

            //
            // Color space conversion
            //

            if (numComp == 3)
            {
                csc709Forward64 (
                    chanData[0]->_dctData,
                    chanData[1]->_dctData,
                    chanData[2]->_dctData);
            }

            quantTable = e->_quantTableY;
            hquantTable = e->_hquantTableY;
            for (int chan = 0; chan < numComp; ++chan)
            {
                //
                // Forward DCT
                //
                dctForward8x8 (chanData[chan]->_dctData);

                //
                // Quantize to half, zigzag, and convert to XDR
                //
                quantizeCoeffAndZigXDR (halfZigCoef, chanData[chan]->_dctData,
                                        quantTable, hquantTable);

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *(chanData[chan]->_dc_comp)++ = halfZigCoef[0];
                e->_numDcComp++;

                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                LossyDctEncoder_rleAc (e, halfZigCoef, &currAcComp);
                quantTable = e->_quantTableCbCr;
                hquantTable = e->_hquantTableCbCr;
            } // chan
        }     // blockx
    }         // blocky

    if (tmpHalfBuffer) free_fn (tmpHalfBuffer);

    return EXR_ERR_SUCCESS;
}